

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

void wabt::anon_unknown_1::ResolveTypeName
               (Module *module,Type *type,Index index,
               unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *bindings)

{
  ulong uVar1;
  uint uVar2;
  const_iterator cVar3;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  
  if ((type->enum_ == Reference) && (type->type_index_ == 0xffffffff)) {
    uVar1 = (bindings->_M_h)._M_bucket_count;
    uVar4 = (ulong)index % uVar1;
    p_Var6 = (bindings->_M_h)._M_buckets[uVar4];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var5 = p_Var6->_M_nxt, p_Var7 = p_Var6, *(Index *)&p_Var6->_M_nxt[1]._M_nxt != index)) {
      while (p_Var6 = p_Var5, p_Var5 = p_Var6->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var5[1]._M_nxt % uVar1 != uVar4) ||
           (p_Var7 = p_Var6, *(uint *)&p_Var5[1]._M_nxt == index)) goto LAB_00141bf1;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_00141bf1:
    if (p_Var7 == (__node_base_ptr)0x0) {
      p_Var5 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var5 = p_Var7->_M_nxt;
    }
    if (p_Var5 == (_Hash_node_base *)0x0) {
      __assert_fail("name_iterator != bindings.cend()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                    ,0x144,
                    "void wabt::(anonymous namespace)::ResolveTypeName(const Module &, Type &, Index, const std::unordered_map<uint32_t, std::string> &)"
                   );
    }
    cVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                    *)&module->type_bindings,(key_type *)(p_Var5 + 2));
    if (cVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar2 = 0xffffffff;
    }
    else {
      uVar2 = *(uint *)((long)cVar3.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_true>
                              ._M_cur + 0x48);
    }
    if (uVar2 == 0xffffffff) {
      __assert_fail("type_index != kInvalidIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                    ,0x146,
                    "void wabt::(anonymous namespace)::ResolveTypeName(const Module &, Type &, Index, const std::unordered_map<uint32_t, std::string> &)"
                   );
    }
    *type = (Type)((ulong)uVar2 << 0x20 | 0xffffffeb);
  }
  return;
}

Assistant:

void ResolveTypeName(
    const Module& module,
    Type& type,
    Index index,
    const std::unordered_map<uint32_t, std::string>& bindings) {
  if (type != Type::Reference || type.GetReferenceIndex() != kInvalidIndex) {
    return;
  }

  const auto name_iterator = bindings.find(index);
  assert(name_iterator != bindings.cend());
  const auto type_index = module.type_bindings.FindIndex(name_iterator->second);
  assert(type_index != kInvalidIndex);
  type = Type(Type::Reference, type_index);
}